

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeSTRPreImm(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar3;
  void *Decoder_00;
  
  uVar3 = Insn >> 0x10 & 0xf;
  uVar2 = uVar3 << 0xd | Insn & 0xfff;
  Decoder_00 = (void *)(ulong)uVar2;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar3]);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0xc & 0xf]);
  DVar1 = DecodeAddrModeImm12Operand(Inst,Insn >> 0xb & 0x1000 | uVar2,Address_00,Decoder_00);
  if ((DVar1 != MCDisassembler_Success) && (DVar1 != MCDisassembler_SoftFail)) {
    return MCDisassembler_Fail;
  }
  DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,(void *)(ulong)DVar1);
  DVar1 = (*(code *)(&DAT_001cccdc + *(int *)(&DAT_001cccdc + (ulong)DVar1 * 4)))();
  return DVar1;
}

Assistant:

static DecodeStatus DecodeSTRPreImm(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrModeImm12Operand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}